

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall
Memory::Recycler::SetupPostCollectionFlags<(Memory::CollectionFlags)402657280>(Recycler *this)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined8 *in_FS_OFFSET;
  BOOL cacheCleanup;
  BOOL decommitNow;
  BOOL exhaustive;
  Recycler *this_local;
  
  if ((this->hasIncompleteDoCollect & 1U) == 0) {
    BVar3 = CollectionInProgress(this);
    if (((BVar3 == 0) && ((this->inDispose & 1U) == 0)) &&
       (((this->inExhaustiveCollection & 1U) != 0 || ((this->inDecommitNowCollection & 1U) != 0))))
    {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0xef1,
                         "(this->hasIncompleteDoCollect || this->CollectionInProgress() || this->inDispose || (!this->inExhaustiveCollection && !this->inDecommitNowCollection))"
                         ,
                         "this->hasIncompleteDoCollect || this->CollectionInProgress() || this->inDispose || (!this->inExhaustiveCollection && !this->inDecommitNowCollection)"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
  }
  return;
}

Assistant:

void Recycler::SetupPostCollectionFlags()
{
    // If we are not in a collection (collection in progress or in dispose), inExhaustiveCollection should not be set
    // Otherwise, we have missed an exhaustive collection.
    Assert(this->hasIncompleteDoCollect ||
        this->CollectionInProgress() || this->inDispose || (!this->inExhaustiveCollection && !this->inDecommitNowCollection));

    // Record whether we want to start exhaustive detection or do decommit now after GC
    const BOOL exhaustive = flags & CollectMode_Exhaustive;
    const BOOL decommitNow = flags & CollectMode_DecommitNow;
    const BOOL cacheCleanup = flags & CollectMode_CacheCleanup;

    if (decommitNow)
    {
        this->inDecommitNowCollection = true;
    }
    if (exhaustive)
    {
        this->inExhaustiveCollection = true;
    }
    if (cacheCleanup)
    {
        this->inCacheCleanupCollection = true;
    }
}